

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

int __thiscall rcg::Device::close(Device *this,int __fd)

{
  int iVar1;
  int iVar2;
  __shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  iVar2 = (int)&local_28;
  std::mutex::lock(&this->mtx);
  if ((0 < this->n_open) && (iVar1 = this->n_open + -1, this->n_open = iVar1, iVar1 == 0)) {
    std::__shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->eventadapter).
                super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>);
    if (this->event != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->GCUnregisterEvent)(this->dev,5);
    }
    (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->DevClose)(this->dev);
    this->event = (void *)0x0;
    this->dev = (void *)0x0;
    this->rp = (void *)0x0;
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodemap).
                super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->rnodemap).
                super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->cport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->rport).super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    Interface::close((this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,iVar2);
  }
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar2;
}

Assistant:

void Device::close()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      eventadapter.reset();

      if (event)
      {
        gentl->GCUnregisterEvent(dev, GenTL::EVENT_MODULE);
      }

      gentl->DevClose(dev);
      dev=0;
      rp=0;
      event=0;

      nodemap=0;
      rnodemap=0;

      cport=0;
      rport=0;

      parent->close();
    }
  }
}